

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt slang::SVInt::concat(span<const_slang::SVInt,_18446744073709551615UL> operands)

{
  uint64_t *puVar1;
  bool bVar2;
  uint32_t uVar3;
  size_type sVar4;
  reference pSVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar6;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar7;
  reverse_iterator it_1;
  bitwidth_t offset;
  reverse_iterator it;
  uint64_t val;
  bitwidth_t offset_1;
  uint32_t words;
  SVInt *op;
  iterator __end1;
  iterator __begin1;
  span<const_slang::SVInt,_18446744073709551615UL> *__range1;
  bool isUnknown;
  bitwidth_t bits;
  SVInt *result;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  pointer in_stack_fffffffffffffec0;
  span<const_slang::SVInt,_18446744073709551615UL> *in_stack_fffffffffffffec8;
  pointer in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffeda;
  undefined1 in_stack_fffffffffffffedb;
  bitwidth_t in_stack_fffffffffffffedc;
  uint32_t in_stack_fffffffffffffef8;
  uint32_t in_stack_fffffffffffffefc;
  pointer in_stack_ffffffffffffff00;
  uint64_t *in_stack_ffffffffffffff08;
  pointer in_stack_ffffffffffffff10;
  uint32_t local_70;
  __normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>
  local_30;
  undefined1 *local_28;
  byte local_1d;
  bitwidth_t local_1c;
  undefined1 local_18 [24];
  
  sVar4 = std::span<const_slang::SVInt,_18446744073709551615UL>::size
                    ((span<const_slang::SVInt,_18446744073709551615UL> *)0x2a3e9f);
  if (sVar4 == 0) {
    SVInt(in_stack_fffffffffffffec0,
          (SVInt *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    uVar6 = extraout_RDX;
  }
  else {
    local_1c = 0;
    local_1d = 0;
    local_28 = local_18;
    local_30._M_current =
         (SVInt *)std::span<const_slang::SVInt,_18446744073709551615UL>::begin
                            ((span<const_slang::SVInt,_18446744073709551615UL> *)
                             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    std::span<const_slang::SVInt,_18446744073709551615UL>::end(in_stack_fffffffffffffec8);
    while (bVar2 = __gnu_cxx::
                   operator==<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffec0,
                              (__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>
                               *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      pSVar5 = __gnu_cxx::
               __normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>
               ::operator*(&local_30);
      local_1c = (pSVar5->super_SVIntStorage).bitWidth + local_1c;
      local_1d = (local_1d & 1) != 0 || ((pSVar5->super_SVIntStorage).unknownFlag & 1U) != 0;
      __gnu_cxx::
      __normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>
      ::operator++(&local_30);
    }
    uVar3 = getNumWords(local_1c,(bool)(local_1d & 1));
    if ((uVar3 == 1) || (local_1c == 0)) {
      std::span<const_slang::SVInt,_18446744073709551615UL>::rbegin(in_stack_fffffffffffffec8);
      while( true ) {
        std::span<const_slang::SVInt,_18446744073709551615UL>::rend(in_stack_fffffffffffffec8);
        bVar2 = std::
                operator==<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                          ((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffffed0,
                           (reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffffec8);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
        ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffffec0);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
        ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffffec0);
        bitcpy((uint64_t *)in_stack_ffffffffffffff10,
               (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
               (uint64_t *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
               in_stack_fffffffffffffef8);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
        ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffffec0);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
      }
      SVInt(in_stack_fffffffffffffed0,(bitwidth_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
            (uint64_t)in_stack_fffffffffffffec0,(bool)in_stack_fffffffffffffebf);
      uVar6 = extraout_RDX_00;
    }
    else {
      allocZeroed(in_stack_fffffffffffffedc,(bool)in_stack_fffffffffffffedb,
                  (bool)in_stack_fffffffffffffeda);
      local_70 = 0;
      std::span<const_slang::SVInt,_18446744073709551615UL>::rbegin(in_stack_fffffffffffffec8);
      while( true ) {
        std::span<const_slang::SVInt,_18446744073709551615UL>::rend(in_stack_fffffffffffffec8);
        bVar2 = std::
                operator==<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                          ((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffffed0,
                           (reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffffec8);
        uVar6 = extraout_RDX_01;
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        getRawData(in_stack_fffffffffffffec0);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
        ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffffec0);
        getRawData(in_stack_fffffffffffffec0);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
        ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffffec0);
        bitcpy((uint64_t *)in_stack_ffffffffffffff10,
               (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
               (uint64_t *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
               in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff10 =
             std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffffec0);
        if (((in_stack_ffffffffffffff10->super_SVIntStorage).unknownFlag & 1U) != 0) {
          in_stack_ffffffffffffff08 = getRawData(in_stack_fffffffffffffec0);
          in_stack_fffffffffffffefc = local_70;
          in_stack_ffffffffffffff00 =
               std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                             *)in_stack_fffffffffffffec0);
          puVar1 = (in_stack_ffffffffffffff00->super_SVIntStorage).field_0.pVal;
          std::
          reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
          ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffffec0);
          uVar3 = getNumWords((SVInt *)0x2a4289);
          in_stack_fffffffffffffec8 =
               (span<const_slang::SVInt,_18446744073709551615UL> *)(puVar1 + (uVar3 >> 1));
          in_stack_fffffffffffffed0 =
               std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                             *)in_stack_fffffffffffffec0);
          bitcpy((uint64_t *)in_stack_ffffffffffffff10,
                 (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                 (uint64_t *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                 in_stack_fffffffffffffef8);
        }
        in_stack_fffffffffffffec0 =
             std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                           *)in_stack_fffffffffffffec0);
        local_70 = (in_stack_fffffffffffffec0->super_SVIntStorage).bitWidth + local_70;
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_slang::SVInt_*,_std::span<const_slang::SVInt,_18446744073709551615UL>_>_>
                      *)in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
      }
    }
  }
  SVar7.super_SVIntStorage.bitWidth = (int)uVar6;
  SVar7.super_SVIntStorage.signFlag = (bool)(char)((ulong)uVar6 >> 0x20);
  SVar7.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)uVar6 >> 0x28);
  SVar7.super_SVIntStorage._14_2_ = (short)((ulong)uVar6 >> 0x30);
  SVar7.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar7.super_SVIntStorage;
}

Assistant:

SVInt SVInt::concat(std::span<SVInt const> operands) {
    // 0 operand concatenations can be valid inside of larger concatenations.
    if (operands.size() == 0)
        return SVInt::Zero;

    // First, compute how many bits total we are dealing with.
    bitwidth_t bits = 0;
    bool isUnknown = false;
    for (const auto& op : operands) {
        bits += op.bitWidth;
        isUnknown |= op.unknownFlag;
    }

    uint32_t words = SVInt::getNumWords(bits, isUnknown);
    if (words == 1 || bits == 0) {
        // The concatenation still fits into a single word.
        bitwidth_t offset = 0;
        uint64_t val = 0;

        // The first operand writes the msb, so operate in reverse.
        for (auto it = operands.rbegin(); it != operands.rend(); it++) {
            bitcpy(&val, offset, &it->val, it->bitWidth);
            offset += it->bitWidth;
        }
        return SVInt(bits, val, false);
    }

    // Result data is zeroed out, which is the proper default, so it doesn't
    // matter that we may not write to certain unknown words or might not
    // write all the way to the end.
    SVInt result = SVInt::allocZeroed(bits, false, isUnknown);

    bitwidth_t offset = 0;
    for (auto it = operands.rbegin(); it != operands.rend(); it++) {
        bitcpy(result.getRawData(), offset, it->getRawData(), it->bitWidth);
        if (it->unknownFlag) {
            bitcpy(result.getRawData() + words / 2, offset, it->pVal + it->getNumWords() / 2,
                   it->bitWidth);
        }
        offset += it->bitWidth;
    }

    return result;
}